

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_config.c
# Opt level: O2

int pt_filter_addr_check(pt_conf_addr_filter *filter,uint64_t addr)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  
  if (filter == (pt_conf_addr_filter *)0x0) {
    iVar2 = -1;
  }
  else {
    uVar1 = (filter->config).addr_cfg;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      if (((((uint)(uVar1 >> ((byte)lVar4 & 0x3f)) & 0xf) == 2) &&
          (*(ulong *)((long)filter->reserved + lVar4 * 4 + -0x40) <= addr)) &&
         (addr <= *(ulong *)((long)filter->reserved + lVar4 * 4 + -0x38))) {
        return 0;
      }
    }
    iVar2 = 1;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      if (((((uint)(uVar1 >> ((byte)lVar4 & 0x3f)) & 0xf) == 1) &&
          (*(ulong *)((long)filter->reserved + lVar4 * 4 + -0x40) <= addr)) &&
         (addr <= *(ulong *)((long)filter->reserved + lVar4 * 4 + -0x38))) {
        return 1;
      }
    }
    lVar4 = 0;
    while (lVar4 + 4 != 0x24) {
      bVar3 = (byte)lVar4;
      lVar4 = lVar4 + 4;
      if (((uint)(uVar1 >> (bVar3 & 0x3f)) & 0xf) == 1) {
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int pt_filter_check_cfg_stop(const struct pt_conf_addr_filter *filter,
				    uint64_t addr)
{
	uint8_t n;

	if (!filter)
		return -pte_internal;

	for (n = 0; n < pt_filter_addr_ncfg(); ++n) {
		uint64_t addr_a, addr_b;
		uint32_t addr_cfg;

		addr_cfg = pt_filter_addr_cfg(filter, n);
		if (addr_cfg != pt_addr_cfg_stop)
			continue;

		addr_a = pt_filter_addr_a(filter, n);
		addr_b = pt_filter_addr_b(filter, n);

		/* Note that both A and B are inclusive. */
		if ((addr_a <= addr) && (addr <= addr_b))
			return 0;
	}

	return 1;
}